

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O3

RemoveResponse * __thiscall
Future<RemoveResponse>::get(RemoveResponse *__return_storage_ptr__,Future<RemoveResponse> *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  short sVar3;
  RemoveResponse local_50;
  
  if ((this->is_done_ == false) &&
     (peVar1 = (this->task_).
               super___shared_ptr<AsyncTask<RemoveResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    (**peVar1->_vptr_AsyncTask)(&local_50);
    (this->result_).super_NamenodeResponse.type_ = local_50.super_NamenodeResponse.type_;
    (this->result_).super_NamenodeResponse.error_ = local_50.super_NamenodeResponse.error_;
    (this->result_).file_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_50.file_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->result_).file_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &local_50.file_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (this->result_).parent_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_50.parent_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->result_).parent_info_.
                super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_50.parent_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    RemoveResponse::~RemoveResponse(&local_50);
    this->is_done_ = true;
  }
  sVar3 = (this->result_).super_NamenodeResponse.error_;
  (__return_storage_ptr__->super_NamenodeResponse).type_ =
       (this->result_).super_NamenodeResponse.type_;
  (__return_storage_ptr__->super_NamenodeResponse).error_ = sVar3;
  (__return_storage_ptr__->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage =
       (_func_int **)&PTR_Update_00130a90;
  (__return_storage_ptr__->file_info_).super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->result_).file_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->result_).file_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (__return_storage_ptr__->file_info_).super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->parent_info_).super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->result_).parent_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->result_).parent_info_.super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (__return_storage_ptr__->parent_info_).super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }